

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O3

dxil_spv_result
dxil_spv_create_converter_with_reflection
          (dxil_spv_parsed_blob blob,dxil_spv_parsed_blob reflection_blob,
          dxil_spv_converter *converter)

{
  dxil_spv_converter pdVar1;
  dxil_spv_result dVar2;
  
  pdVar1 = (dxil_spv_converter)operator_new(0x188,(nothrow_t *)&std::nothrow);
  if (pdVar1 == (dxil_spv_converter)0x0) {
    dVar2 = DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  else {
    pdVar1->bc_parser = &blob->bc;
    pdVar1->bc_reflection_parser = &reflection_blob->bc;
    (pdVar1->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pdVar1->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dVar2 = DXIL_SPV_SUCCESS;
    (pdVar1->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pdVar1->entry_point)._M_dataplus._M_p = (pointer)&(pdVar1->entry_point).field_2;
    (pdVar1->entry_point)._M_string_length = 0;
    (pdVar1->entry_point).field_2._M_local_buf[0] = '\0';
    (pdVar1->compiled_entry_point)._M_dataplus._M_p =
         (pointer)&(pdVar1->compiled_entry_point).field_2;
    (pdVar1->compiled_entry_point)._M_string_length = 0;
    (pdVar1->compiled_entry_point).field_2._M_local_buf[0] = '\0';
    (pdVar1->analysis_warnings)._M_dataplus._M_p = (pointer)&(pdVar1->analysis_warnings).field_2;
    (pdVar1->analysis_warnings)._M_string_length = 0;
    (pdVar1->analysis_warnings).field_2._M_local_buf[0] = '\0';
    (pdVar1->remapper).super_ResourceRemappingInterface._vptr_ResourceRemappingInterface =
         (_func_int **)&PTR__ResourceRemappingInterface_001f3140;
    memset(&(pdVar1->remapper).srv_remapper,0,0xd2);
    pdVar1->workgroup_size[0] = 0;
    pdVar1->workgroup_size[1] = 0;
    *(undefined8 *)(pdVar1->workgroup_size + 2) = 0;
    pdVar1->wave_size_min = 0;
    pdVar1->wave_size_max = 0;
    pdVar1->wave_size_preferred = 0;
    pdVar1->heuristic_wave_size = 0;
    pdVar1->shader_feature_used[0] = false;
    *converter = pdVar1;
  }
  return dVar2;
}

Assistant:

dxil_spv_result dxil_spv_create_converter_with_reflection(dxil_spv_parsed_blob blob,
                                                          dxil_spv_parsed_blob reflection_blob,
                                                          dxil_spv_converter *converter)
{
	auto *conv = new (std::nothrow) dxil_spv_converter_s(blob->bc, reflection_blob ? &reflection_blob->bc : nullptr);
	if (!conv)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	*converter = conv;
	return DXIL_SPV_SUCCESS;
}